

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_pss.cc
# Opt level: O0

EVP_MD * rsa_mgf1_to_md(X509_ALGOR *alg)

{
  X509_ALGOR *a;
  EVP_MD *ret;
  X509_ALGOR *maskHash;
  X509_ALGOR *alg_local;
  
  if (alg == (X509_ALGOR *)0x0) {
    ERR_put_error(0xb,0,0x70,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                  ,0x8e);
    alg_local = (X509_ALGOR *)0x0;
  }
  else {
    a = (X509_ALGOR *)rsa_mgf1_decode(alg);
    if (a == (X509_ALGOR *)0x0) {
      ERR_put_error(0xb,0,0x70,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                    ,0x94);
      alg_local = (X509_ALGOR *)0x0;
    }
    else {
      alg_local = (X509_ALGOR *)rsa_algor_to_md((X509_ALGOR *)a);
      X509_ALGOR_free(a);
    }
  }
  return (EVP_MD *)alg_local;
}

Assistant:

static const EVP_MD *rsa_mgf1_to_md(const X509_ALGOR *alg) {
  if (!alg) {
    // If omitted, PSS defaults to MGF-1 with SHA-1, which we do not allow.
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
    return NULL;
  }
  // Check mask and lookup mask hash algorithm.
  X509_ALGOR *maskHash = rsa_mgf1_decode(alg);
  if (maskHash == NULL) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
    return NULL;
  }
  const EVP_MD *ret = rsa_algor_to_md(maskHash);
  X509_ALGOR_free(maskHash);
  return ret;
}